

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O1

void __thiscall
jbcoin::STParsedJSONArray::STParsedJSONArray(STParsedJSONArray *this,string *name,Value *json)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  optional<jbcoin::detail::STVar> arr;
  undefined1 local_98 [120];
  
  (this->array).super_type.m_initialized = false;
  puVar1 = &(this->error).field_0x8;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfe00;
  STParsedJSONDetail::parseArray
            ((optional<jbcoin::detail::STVar> *)local_98,name,json,(SField *)sfGeneric,0,
             &this->error);
  if ((local_98[0] == false) || (*(undefined ***)local_98._96_8_ != &PTR__STArray_002d6ed8)) {
    boost::optional_detail::optional_base<jbcoin::STArray>::assign
              ((optional_base<jbcoin::STArray> *)this);
  }
  else {
    boost::optional_detail::optional_base<jbcoin::STArray>::assign
              ((optional_base<jbcoin::STArray> *)this,(rval_reference_type)local_98._96_8_);
  }
  if (local_98[0] == true) {
    if ((rval_reference_type)local_98._96_8_ == (rval_reference_type)(local_98 + 0x10)) {
      puVar2 = *(undefined8 **)local_98._96_8_;
    }
    else {
      if ((rval_reference_type)local_98._96_8_ == (rval_reference_type)0x0) {
        return;
      }
      puVar2 = (undefined8 *)(*(long *)local_98._96_8_ + 8);
    }
    (*(code *)*puVar2)();
  }
  return;
}

Assistant:

STParsedJSONArray::STParsedJSONArray (
    std::string const& name,
    Json::Value const& json)
{
    using namespace STParsedJSONDetail;
    auto arr = parseArray (name, json, sfGeneric, 0, error);
    if (!arr)
        array = boost::none;
    else
    {
        auto p = dynamic_cast <STArray*> (&arr->get());
        if (p == nullptr)
            array = boost::none;
        else
            array = std::move (*p);
    }
}